

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexDebug.cpp
# Opt level: O0

HighsDebugStatus debugNonbasicFlagConsistent(HighsOptions *options,HighsLp *lp,SimplexBasis *basis)

{
  int iVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  long in_RDX;
  int *in_RSI;
  long in_RDI;
  bool right_num_basic_variables;
  HighsInt var;
  HighsInt num_basic_variables;
  bool right_size;
  HighsInt numTot;
  HighsDebugStatus return_status;
  int local_34;
  uint local_30;
  HighsDebugStatus local_24;
  HighsDebugStatus local_4;
  
  if (*(int *)(in_RDI + 0x15c) < 1) {
    local_4 = kNotChecked;
  }
  else {
    local_24 = kOk;
    iVar1 = *in_RSI;
    iVar2 = in_RSI[1];
    sVar3 = std::vector<signed_char,_std::allocator<signed_char>_>::size
                      ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDX + 0x18));
    if ((int)sVar3 != iVar1 + iVar2) {
      highsLogDev((HighsLogOptions *)(in_RDI + 0x380),kError,"nonbasicFlag size error\n");
      local_24 = kLogicalError;
    }
    local_30 = 0;
    for (local_34 = 0; local_34 < iVar1 + iVar2; local_34 = local_34 + 1) {
      pvVar4 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDX + 0x18),
                          (long)local_34);
      if (*pvVar4 == '\0') {
        local_30 = local_30 + 1;
      }
    }
    if (local_30 != in_RSI[1]) {
      highsLogDev((HighsLogOptions *)(in_RDI + 0x380),kError,
                  "nonbasicFlag has %d, not %d basic variables\n",(ulong)local_30,
                  (ulong)(uint)in_RSI[1]);
      local_24 = kLogicalError;
    }
    local_4 = local_24;
  }
  return local_4;
}

Assistant:

HighsDebugStatus debugNonbasicFlagConsistent(const HighsOptions& options,
                                             const HighsLp& lp,
                                             const SimplexBasis& basis) {
  if (options.highs_debug_level < kHighsDebugLevelCheap)
    return HighsDebugStatus::kNotChecked;
  HighsDebugStatus return_status = HighsDebugStatus::kOk;
  HighsInt numTot = lp.num_col_ + lp.num_row_;
  const bool right_size = (HighsInt)basis.nonbasicFlag_.size() == numTot;
  if (!right_size) {
    highsLogDev(options.log_options, HighsLogType::kError,
                "nonbasicFlag size error\n");
    assert(right_size);
    return_status = HighsDebugStatus::kLogicalError;
  }
  HighsInt num_basic_variables = 0;
  for (HighsInt var = 0; var < numTot; var++) {
    if (basis.nonbasicFlag_[var] == kNonbasicFlagFalse) {
      num_basic_variables++;
    } else {
      assert(basis.nonbasicFlag_[var] == kNonbasicFlagTrue);
    }
  }
  bool right_num_basic_variables = num_basic_variables == lp.num_row_;
  if (!right_num_basic_variables) {
    highsLogDev(options.log_options, HighsLogType::kError,
                "nonbasicFlag has %" HIGHSINT_FORMAT ", not %" HIGHSINT_FORMAT
                " basic variables\n",
                num_basic_variables, lp.num_row_);
    assert(right_num_basic_variables);
    return_status = HighsDebugStatus::kLogicalError;
  }
  return return_status;
}